

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

QString * errorCodeToUString(QString *__return_storage_ptr__,USTATUS errorCode)

{
  USTATUS errorCode_local;
  
  switch(errorCode) {
  case 0:
    QString::QString(__return_storage_ptr__,"Success");
    break;
  case 1:
    QString::QString(__return_storage_ptr__,"Function called with invalid parameter");
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"Buffer too small");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"Out of resources");
    break;
  case 4:
    QString::QString(__return_storage_ptr__,"Out of memory");
    break;
  case 5:
    QString::QString(__return_storage_ptr__,"File can\'t be opened");
    break;
  case 6:
    QString::QString(__return_storage_ptr__,"File can\'t be read");
    break;
  case 7:
    QString::QString(__return_storage_ptr__,"File can\'t be written");
    break;
  case 8:
    QString::QString(__return_storage_ptr__,"Item not found");
    break;
  case 9:
    QString::QString(__return_storage_ptr__,"Unknown item type");
    break;
  case 10:
    QString::QString(__return_storage_ptr__,"Invalid flash descriptor");
    break;
  case 0xb:
    QString::QString(__return_storage_ptr__,"Invalid region");
    break;
  case 0xc:
    QString::QString(__return_storage_ptr__,"Empty region");
    break;
  case 0xd:
    QString::QString(__return_storage_ptr__,"BIOS region not found");
    break;
  case 0xe:
    QString::QString(__return_storage_ptr__,"UEFI volumes not found");
    break;
  case 0xf:
    QString::QString(__return_storage_ptr__,"Invalid UEFI volume");
    break;
  case 0x10:
    QString::QString(__return_storage_ptr__,"Volume revision not supported");
    break;
  case 0x11:
    QString::QString(__return_storage_ptr__,"Block map structure too complex for correct analysis");
    break;
  case 0x12:
    QString::QString(__return_storage_ptr__,"Unknown file system");
    break;
  case 0x13:
    QString::QString(__return_storage_ptr__,"Invalid file");
    break;
  case 0x14:
    QString::QString(__return_storage_ptr__,"Invalid section");
    break;
  case 0x15:
    QString::QString(__return_storage_ptr__,"Unknown section");
    break;
  case 0x16:
    QString::QString(__return_storage_ptr__,"Standard compression failed");
    break;
  case 0x17:
    QString::QString(__return_storage_ptr__,"Customized compression failed");
    break;
  case 0x18:
    QString::QString(__return_storage_ptr__,"Standard decompression failed");
    break;
  case 0x19:
    QString::QString(__return_storage_ptr__,"Customized decompression failed");
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown error %02lX",errorCode);
    break;
  case 0x1b:
    QString::QString(__return_storage_ptr__,"Unknown compression type");
    break;
  case 0x1c:
    QString::QString(__return_storage_ptr__,"Dependency expression parsing failed");
    break;
  case 0x1d:
    QString::QString(__return_storage_ptr__,"Unknown extract mode");
    break;
  case 0x1e:
    QString::QString(__return_storage_ptr__,"Unknown replace mode");
    break;
  case 0x1f:
    QString::QString(__return_storage_ptr__,"Unknown executable image type");
    break;
  case 0x20:
    QString::QString(__return_storage_ptr__,"Unknown PE optional header type");
    break;
  case 0x21:
    QString::QString(__return_storage_ptr__,"Unknown relocation type");
    break;
  case 0x22:
    QString::QString(__return_storage_ptr__,"Directory already exists");
    break;
  case 0x23:
    QString::QString(__return_storage_ptr__,"Directory can\'t be created");
    break;
  case 0x24:
    QString::QString(__return_storage_ptr__,"Change directory failed");
    break;
  case 0x25:
    QString::QString(__return_storage_ptr__,"Image is truncated");
    break;
  case 0x26:
    QString::QString(__return_storage_ptr__,"Invalid capsule");
    break;
  case 0x27:
    QString::QString(__return_storage_ptr__,"Stores not found");
    break;
  case 0x32:
    QString::QString(__return_storage_ptr__,"Invalid store size");
    break;
  case 0x39:
    QString::QString(__return_storage_ptr__,"Invalid store");
    break;
  case 0xff:
    QString::QString(__return_storage_ptr__,"Not implemented");
  }
  return __return_storage_ptr__;
}

Assistant:

UString errorCodeToUString(USTATUS errorCode)
{
    // TODO: improve
    switch (errorCode) {
        case U_SUCCESS:                         return UString("Success");
        case U_NOT_IMPLEMENTED:                 return UString("Not implemented");
        case U_INVALID_PARAMETER:               return UString("Function called with invalid parameter");
        case U_BUFFER_TOO_SMALL:                return UString("Buffer too small");
        case U_OUT_OF_RESOURCES:                return UString("Out of resources");
        case U_OUT_OF_MEMORY:                   return UString("Out of memory");
        case U_FILE_OPEN:                       return UString("File can't be opened");
        case U_FILE_READ:                       return UString("File can't be read");
        case U_FILE_WRITE:                      return UString("File can't be written");
        case U_ITEM_NOT_FOUND:                  return UString("Item not found");
        case U_UNKNOWN_ITEM_TYPE:               return UString("Unknown item type");
        case U_INVALID_FLASH_DESCRIPTOR:        return UString("Invalid flash descriptor");
        case U_INVALID_REGION:                  return UString("Invalid region");
        case U_EMPTY_REGION:                    return UString("Empty region");
        case U_BIOS_REGION_NOT_FOUND:           return UString("BIOS region not found");
        case U_VOLUMES_NOT_FOUND:               return UString("UEFI volumes not found");
        case U_INVALID_VOLUME:                  return UString("Invalid UEFI volume");
        case U_VOLUME_REVISION_NOT_SUPPORTED:   return UString("Volume revision not supported");
        case U_UNKNOWN_FFS:                     return UString("Unknown file system");
        case U_INVALID_FILE:                    return UString("Invalid file");
        case U_INVALID_SECTION:                 return UString("Invalid section");
        case U_UNKNOWN_SECTION:                 return UString("Unknown section");
        case U_STANDARD_COMPRESSION_FAILED:     return UString("Standard compression failed");
        case U_CUSTOMIZED_COMPRESSION_FAILED:   return UString("Customized compression failed");
        case U_STANDARD_DECOMPRESSION_FAILED:   return UString("Standard decompression failed");
        case U_CUSTOMIZED_DECOMPRESSION_FAILED: return UString("Customized decompression failed");
        case U_UNKNOWN_COMPRESSION_TYPE:        return UString("Unknown compression type");
        case U_UNKNOWN_EXTRACT_MODE:            return UString("Unknown extract mode");
        case U_UNKNOWN_REPLACE_MODE:            return UString("Unknown replace mode");
        case U_UNKNOWN_IMAGE_TYPE:              return UString("Unknown executable image type");
        case U_UNKNOWN_PE_OPTIONAL_HEADER_TYPE: return UString("Unknown PE optional header type");
        case U_UNKNOWN_RELOCATION_TYPE:         return UString("Unknown relocation type");
        case U_COMPLEX_BLOCK_MAP:               return UString("Block map structure too complex for correct analysis");
        case U_DIR_ALREADY_EXIST:               return UString("Directory already exists");
        case U_DIR_CREATE:                      return UString("Directory can't be created");
        case U_DIR_CHANGE:                      return UString("Change directory failed");
        case U_DEPEX_PARSE_FAILED:              return UString("Dependency expression parsing failed");
        case U_TRUNCATED_IMAGE:                 return UString("Image is truncated");
        case U_INVALID_CAPSULE:                 return UString("Invalid capsule");
        case U_STORES_NOT_FOUND:                return UString("Stores not found");
        case U_INVALID_STORE_SIZE:              return UString("Invalid store size");
        case U_INVALID_STORE:                   return UString("Invalid store");
        default:                                return usprintf("Unknown error %02lX", errorCode);
    }
}